

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O1

int convolution_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  float fVar1;
  convolution_segment_data *data;
  int iVar2;
  code *pcVar3;
  uint32_t size;
  float *fir;
  uint32_t local_24;
  float *local_20;
  
  data = (convolution_segment_data *)segment->data;
  if ((int)field < 0x29) {
    if (field == 1) {
      pcVar3 = convolution_segment_mix;
      if (*value != '\0') {
        pcVar3 = convolution_segment_mix_bypass;
      }
LAB_00138e9a:
      segment->mix = pcVar3;
      return 1;
    }
    if (field != 2) goto LAB_00138e3d;
    if (*value != 0) {
      data->samplerate = *value;
      free_fft_window_data(&data->fft_window_data);
      iVar2 = make_fft_window_data(data->block_size,4,data->samplerate,&data->fft_window_data);
      if (iVar2 == 0) {
        return 0;
      }
      return 1;
    }
  }
  else {
    if (field != 0x29) {
      if (field == 0x3c) {
        local_24 = 0xffffffff;
        mixed_buffer_request_read(&local_20,&local_24,(mixed_buffer *)value);
        iVar2 = update_fir(local_20,local_24,data);
        return iVar2;
      }
LAB_00138e3d:
      iVar2 = 7;
      goto LAB_00138e8a;
    }
    fVar1 = *value;
    if ((0.0 <= fVar1) && (fVar1 <= 1.0)) {
      data->mix = fVar1;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        pcVar3 = convolution_segment_mix;
      }
      else {
        pcVar3 = convolution_segment_mix_bypass;
      }
      goto LAB_00138e9a;
    }
  }
  iVar2 = 8;
LAB_00138e8a:
  mixed_err(iVar2);
  return 0;
}

Assistant:

int convolution_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct convolution_segment_data *data = (struct convolution_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE:
    if(*(uint32_t *)value <= 0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->samplerate = *(uint32_t *)value;
    free_fft_window_data(&data->fft_window_data);
    if(!make_fft_window_data(data->block_size, 4, data->samplerate, &data->fft_window_data)){
      return 0;
    }
    break;
  case MIXED_FIR: {
    float *fir;
    uint32_t size = 0xFFFFFFFF;
    mixed_buffer_request_read(&fir, &size, (struct mixed_buffer *)value);
    return update_fir(fir, size, data);
    break;}
  case MIXED_MIX:
    if(*(float *)value < 0 || 1 < *(float *)value){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->mix = *(float *)value;
    if(data->mix == 0){
      bool bypass = 1;
      return convolution_segment_set(MIXED_BYPASS, &bypass, segment);
    }else{
      bool bypass = 0;
      return convolution_segment_set(MIXED_BYPASS, &bypass, segment);
    }
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = convolution_segment_mix_bypass;
    }else{
      segment->mix = convolution_segment_mix;
    }
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}